

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O1

int str_gsub(lua_State *L)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  lua_State *L_00;
  uint uVar4;
  int iVar5;
  char *s;
  char *p;
  char *e;
  char *pcVar6;
  ushort **ppuVar7;
  ulong n;
  ulong uVar8;
  size_t lp;
  size_t l;
  size_t srcl;
  MatchState ms;
  luaL_Buffer b;
  size_t local_22c0;
  ulong local_22b8;
  lua_State *local_22b0;
  char *local_22a8;
  size_t local_22a0;
  ulong local_2298;
  ulong local_2290;
  size_t local_2288;
  MatchState local_2280;
  luaL_Buffer local_2050;
  ulong uVar9;
  
  s = luaL_checklstring(L,1,&local_2288);
  p = luaL_checklstring(L,2,&local_22c0);
  uVar4 = lua_type(L,3);
  local_2290 = luaL_optinteger(L,4,local_2288 + 1);
  cVar1 = *p;
  local_2298 = (ulong)uVar4;
  if (3 < uVar4 - 3) {
    luaL_argerror(L,3,"string/function/table expected");
  }
  luaL_buffinit(L,&local_2050);
  if (cVar1 == '^') {
    p = p + 1;
    local_22c0 = local_22c0 - 1;
  }
  local_2280.matchdepth = 200;
  local_2280.src_end = s + local_2288;
  local_2280.p_end = p + local_22c0;
  n = 0;
  local_22b0 = L;
  local_22a8 = p;
  local_2280.src_init = s;
  local_2280.L = L;
  do {
    if (local_2290 <= n) break;
    local_2280.level = 0;
    e = match(&local_2280,s,p);
    L_00 = local_2280.L;
    if (e != (char *)0x0) {
      n = n + 1;
      if ((int)local_2298 == 5) {
        push_onecapture(&local_2280,0,s,e);
        lua_gettable(L_00,3);
      }
      else {
        if ((int)local_2298 != 6) {
          pcVar6 = lua_tolstring(local_2280.L,3,&local_22b8);
          p = local_22a8;
          if (local_22b8 != 0) {
            local_22a0 = (long)e - (long)s;
            uVar8 = 0;
            do {
              if (pcVar6[uVar8] == '%') {
                uVar9 = uVar8 + 1;
                ppuVar7 = __ctype_b_loc();
                bVar2 = pcVar6[uVar8 + 1];
                if ((*(byte *)((long)*ppuVar7 + (ulong)bVar2 * 2 + 1) & 8) == 0) {
                  if (bVar2 != 0x25) {
                    luaL_error(local_2280.L,"invalid use of \'%c\' in replacement string",0x25);
                  }
                  if (local_2050.size <= local_2050.n) {
                    luaL_prepbuffsize(&local_2050,1);
                  }
                  local_2050.b[local_2050.n] = pcVar6[uVar9];
                  local_2050.n = local_2050.n + 1;
                }
                else if (bVar2 == 0x30) {
                  luaL_addlstring(&local_2050,s,local_22a0);
                }
                else {
                  push_onecapture(&local_2280,(char)bVar2 + -0x31,s,e);
                  luaL_addvalue(&local_2050);
                }
              }
              else {
                if (local_2050.size <= local_2050.n) {
                  luaL_prepbuffsize(&local_2050,1);
                }
                local_2050.b[local_2050.n] = pcVar6[uVar8];
                uVar9 = uVar8;
                local_2050.n = local_2050.n + 1;
              }
              uVar8 = uVar9 + 1;
              p = local_22a8;
            } while (uVar8 < local_22b8);
          }
          goto LAB_001198d6;
        }
        lua_pushvalue(local_2280.L,3);
        iVar5 = push_captures(&local_2280,s,e);
        lua_callk(L_00,iVar5,1,0,(lua_CFunction)0x0);
      }
      iVar5 = lua_toboolean(L_00,-1);
      if (iVar5 == 0) {
        lua_settop(L_00,-2);
        lua_pushlstring(L_00,s,(long)e - (long)s);
      }
      else {
        iVar5 = lua_isstring(L_00,-1);
        if (iVar5 == 0) {
          iVar5 = lua_type(L_00,-1);
          pcVar6 = lua_typename(L_00,iVar5);
          luaL_error(L_00,"invalid replacement value (a %s)",pcVar6);
        }
      }
      luaL_addvalue(&local_2050);
    }
LAB_001198d6:
    bVar3 = cVar1 != '^';
    if (e == (char *)0x0 || e <= s) {
      if (s < local_2280.src_end) {
        if (local_2050.size <= local_2050.n) {
          luaL_prepbuffsize(&local_2050,1);
        }
        local_2050.b[local_2050.n] = *s;
        e = s + 1;
        local_2050.n = local_2050.n + 1;
      }
      else {
        bVar3 = false;
        e = s;
      }
    }
    s = e;
  } while (bVar3);
  luaL_addlstring(&local_2050,s,(long)local_2280.src_end - (long)s);
  luaL_pushresult(&local_2050);
  lua_pushinteger(local_22b0,n);
  return 2;
}

Assistant:

static int str_gsub (lua_State *L) {
  size_t srcl, lp;
  const char *src = luaL_checklstring(L, 1, &srcl);
  const char *p = luaL_checklstring(L, 2, &lp);
  int tr = lua_type(L, 3);
  size_t max_s = luaL_optinteger(L, 4, srcl+1);
  int anchor = (*p == '^');
  size_t n = 0;
  MatchState ms;
  luaL_Buffer b;
  luaL_argcheck(L, tr == LUA_TNUMBER || tr == LUA_TSTRING ||
                   tr == LUA_TFUNCTION || tr == LUA_TTABLE, 3,
                      "string/function/table expected");
  luaL_buffinit(L, &b);
  if (anchor) {
    p++; lp--;  /* skip anchor character */
  }
  ms.L = L;
  ms.matchdepth = MAXCCALLS;
  ms.src_init = src;
  ms.src_end = src+srcl;
  ms.p_end = p + lp;
  while (n < max_s) {
    const char *e;
    ms.level = 0;
    lua_assert(ms.matchdepth == MAXCCALLS);
    e = match(&ms, src, p);
    if (e) {
      n++;
      add_value(&ms, &b, src, e, tr);
    }
    if (e && e>src) /* non empty match? */
      src = e;  /* skip it */
    else if (src < ms.src_end)
      luaL_addchar(&b, *src++);
    else break;
    if (anchor) break;
  }
  luaL_addlstring(&b, src, ms.src_end-src);
  luaL_pushresult(&b);
  lua_pushinteger(L, n);  /* number of substitutions */
  return 2;
}